

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  uv_loop_t *loop;
  char *pcVar7;
  undefined1 local_220 [16];
  uv_fs_t fs_req;
  uv_stdio_container_t stdio [3];
  
  unlink("stdout_file");
  unlink("stderr_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar3 = uv_fs_open(0,&fs_req,"stdout_file",0x42,0x180,0);
  if (iVar3 == -1) {
    pcVar7 = "r != -1";
    uVar6 = 0x200;
  }
  else {
    uv_fs_req_cleanup(&fs_req);
    iVar3 = dup2(iVar3,1);
    if (iVar3 == -1) {
      pcVar7 = "stdout_file != -1";
      uVar6 = 0x203;
    }
    else {
      iVar4 = uv_fs_open(0,&fs_req,"stderr_file",0x42,0x180,0);
      if (iVar4 == -1) {
        pcVar7 = "r != -1";
        uVar6 = 0x208;
      }
      else {
        uv_fs_req_cleanup(&fs_req);
        iVar4 = dup2(iVar4,2);
        if (iVar4 == -1) {
          pcVar7 = "stderr_file != -1";
          uVar6 = 0x20b;
        }
        else {
          options.stdio = stdio;
          stdio[0].flags = UV_IGNORE;
          options.stdio_count = 3;
          stdio[1].flags = UV_INHERIT_FD;
          stdio[1].data._0_4_ = iVar4;
          stdio[2].flags = UV_INHERIT_FD;
          stdio[2].data._0_4_ = iVar3;
          uVar6 = uv_default_loop();
          iVar5 = uv_spawn(uVar6,&process,&options);
          if (iVar5 == 0) {
            uVar6 = uv_default_loop();
            iVar5 = uv_run(uVar6,0);
            auVar2._8_8_ = local_220._8_8_;
            auVar2._0_8_ = local_220._0_8_;
            auVar1._8_8_ = local_220._8_8_;
            auVar1._0_8_ = local_220._0_8_;
            if (iVar5 == 0) {
              if (exit_cb_called == 1) {
                if (close_cb_called == 1) {
                  local_220 = uv_buf_init(output,0x400);
                  iVar5 = uv_fs_read(0,&fs_req,iVar3,local_220,1,0,0);
                  if (iVar5 < 0xf) {
                    pcVar7 = "r >= 15";
                    uVar6 = 0x224;
                  }
                  else {
                    uv_fs_req_cleanup(&fs_req);
                    iVar3 = uv_fs_close(0,&fs_req,iVar3,0);
                    if (iVar3 == 0) {
                      uv_fs_req_cleanup(&fs_req);
                      printf("output is: %s",output);
                      iVar3 = bcmp("hello errworld\n",output,0xf);
                      if (iVar3 == 0) {
                        iVar3 = uv_fs_read(0,&fs_req,iVar4,local_220,1,0,0);
                        if (iVar3 < 0xc) {
                          pcVar7 = "r >= 12";
                          uVar6 = 0x230;
                        }
                        else {
                          uv_fs_req_cleanup(&fs_req);
                          iVar3 = uv_fs_close(0,&fs_req,iVar4,0);
                          if (iVar3 == 0) {
                            uv_fs_req_cleanup(&fs_req);
                            printf("output is: %s",output);
                            iVar3 = bcmp("hello world\n",output,0xc);
                            if (iVar3 == 0) {
                              unlink("stdout_file");
                              unlink("stderr_file");
                              loop = (uv_loop_t *)uv_default_loop();
                              close_loop(loop);
                              uVar6 = uv_default_loop();
                              iVar3 = uv_loop_close(uVar6);
                              if (iVar3 == 0) {
                                return 0;
                              }
                              pcVar7 = "0 == uv_loop_close(uv_default_loop())";
                              uVar6 = 0x23e;
                            }
                            else {
                              pcVar7 = "strncmp(\"hello world\\n\", output, 12) == 0";
                              uVar6 = 0x238;
                            }
                          }
                          else {
                            pcVar7 = "r == 0";
                            uVar6 = 0x234;
                          }
                        }
                      }
                      else {
                        pcVar7 = "strncmp(\"hello errworld\\n\", output, 15) == 0";
                        uVar6 = 0x22c;
                      }
                    }
                    else {
                      pcVar7 = "r == 0";
                      uVar6 = 0x228;
                    }
                  }
                }
                else {
                  pcVar7 = "close_cb_called == 1";
                  uVar6 = 0x21e;
                  local_220 = auVar1;
                }
              }
              else {
                pcVar7 = "exit_cb_called == 1";
                uVar6 = 0x21d;
                local_220 = auVar2;
              }
            }
            else {
              pcVar7 = "r == 0";
              uVar6 = 0x21b;
            }
          }
          else {
            pcVar7 = "r == 0";
            uVar6 = 0x218;
          }
        }
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar6,pcVar7);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_file stdout_file;
  uv_file stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(r, STDOUT_FILENO);
  ASSERT(stdout_file != -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(r, STDERR_FILENO);
  ASSERT(stderr_file != -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT(r >= 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello errworld\n", output, 15) == 0);

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT(r >= 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello world\n", output, 12) == 0);

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}